

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  bool bVar1;
  char cVar2;
  invalid_argument *piVar3;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> local_238;
  ifstream ifs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220 [64];
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>((Args *)&ifs);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)&ifs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_220);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)&ifs);
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&ifs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_220);
  bVar1 = std::operator==(&((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           input,"-");
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Cannot use stdin for training!");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ifstream::ifstream
            (&ifs,(string *)
                  &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->input,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    Dictionary::readFromFile
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(istream *)&ifs);
    std::ifstream::close();
    if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        pretrainedVectors)._M_string_length == 0) {
      createRandomMatrix((FastText *)&loss);
    }
    else {
      getInputMatrixFromFile((FastText *)&loss,(string *)this);
    }
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&loss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    createTrainOutputMatrix((FastText *)&loss);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&loss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this->quant_ = false;
    createLoss((FastText *)&loss,(shared_ptr<fasttext::Matrix> *)this);
    std::
    make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
              ((shared_ptr<fasttext::Matrix> *)&local_238,&this->input_,
               (shared_ptr<fasttext::Loss> *)&this->output_,(bool *)&loss);
    std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
               &local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
    startThreads(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::ifstream::~ifstream(&ifs);
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loss,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->input," cannot be opened for training!");
  std::invalid_argument::invalid_argument(piVar3,(string *)&loss);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::train(const Args& args) {
  args_ = std::make_shared<Args>(args);
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    throw std::invalid_argument("Cannot use stdin for training!");
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    throw std::invalid_argument(
        args_->input + " cannot be opened for training!");
  }
  //dict_->readFromFile(ifs);
  (*dict_).readFromFile(ifs);//its the same as above
  ifs.close();

  if (!args_->pretrainedVectors.empty()) {
    input_ = getInputMatrixFromFile(args_->pretrainedVectors);
  } else {
    input_ = createRandomMatrix();
  }
  output_ = createTrainOutputMatrix();
  quant_ = false;
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
  startThreads();
}